

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpec::Filter::serializeTo(Filter *this,ostream *out)

{
  bool bVar1;
  bool bVar2;
  reference puVar3;
  Pattern *pPVar4;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1_1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  bool first;
  ostream *out_local;
  Filter *this_local;
  
  bVar1 = true;
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ::begin(&this->m_required);
  pattern = (unique_ptr<Catch::TestSpec::Pattern> *)
            std::
            vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
            ::end(&this->m_required);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                                *)&pattern);
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
             ::operator*(&__end1);
    if (!bVar1) {
      std::operator<<(out,' ');
    }
    pPVar4 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator*(puVar3);
    Catch::operator<<(out,pPVar4);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
             ::begin(&this->m_forbidden);
  pattern_1 = (unique_ptr<Catch::TestSpec::Pattern> *)
              std::
              vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
              ::end(&this->m_forbidden);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                        *)&pattern_1);
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
             ::operator*(&__end1_1);
    if (!bVar1) {
      std::operator<<(out,' ');
    }
    pPVar4 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator*(puVar3);
    Catch::operator<<(out,pPVar4);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void TestSpec::Filter::serializeTo( std::ostream& out ) const {
        bool first = true;
        for ( auto const& pattern : m_required ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
        for ( auto const& pattern : m_forbidden ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
    }